

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O2

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::choose_leaf(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *this,indexable_type *entry)

{
  tree_type *this_00;
  stored_size_type sVar1;
  type_conflict1 tVar2;
  type_conflict1 tVar3;
  reference prVar4;
  reference puVar5;
  reference prVar6;
  pointer bg;
  boundary_type *b;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *in_R8;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  const_iterator i;
  node_type n;
  double local_c0;
  double local_b8;
  unsigned_long local_a8;
  vec_iterator<unsigned_long_*,_true> local_a0;
  node_type local_98;
  
  local_a8 = this->root_;
  if (local_a8 == 0xffffffffffffffff) {
    local_98.is_leaf = true;
    local_98.parent = 0xffffffffffffffff;
    local_98.entry.
    super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    .m_holder.m_size = 0;
    local_98.box.center.values_.elems[0] = (entry->center).values_.elems[0];
    local_98.box.center.values_.elems[1] = (entry->center).values_.elems[1];
    local_98.box.radius.values_.elems[0] = (entry->radius).values_.elems[0];
    local_98.box.radius.values_.elems[1] = (entry->radius).values_.elems[1];
    local_a8 = add_node(this,&local_98);
    this->root_ = local_a8;
  }
  else {
    this_00 = &this->tree_;
    b = &this->boundary_;
    while (prVar4 = boost::container::
                    vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                    ::at(this_00,local_a8), prVar4->is_leaf == false) {
      prVar4 = boost::container::
               vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
               ::at(this_00,local_a8);
      local_a0.m_ptr = (unsigned_long *)&prVar4->entry;
      sVar1 = (prVar4->entry).
              super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
              .m_holder.m_size;
      uVar7 = 0xffffffff;
      uVar8 = 0x7fefffff;
      local_b8 = 1.79769313486232e+308;
      while ((double *)local_a0.m_ptr != (prVar4->box).center.values_.elems + (sVar1 - 7)) {
        local_c0 = (double)CONCAT44(uVar8,uVar7);
        puVar5 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&local_a0);
        prVar6 = boost::container::
                 vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                 ::at(this_00,*puVar5);
        tVar2 = area<perior::point<double,2ul>,perior::cubic_periodic_boundary>(&prVar6->box,b);
        puVar5 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&local_a0);
        prVar6 = boost::container::
                 vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                 ::at(this_00,*puVar5);
        expand<perior::point<double,2ul>>
                  ((type *)&local_98,(perior *)&prVar6->box,entry,
                   (rectangle<perior::point<double,_2UL>_> *)b,in_R8);
        tVar3 = area<perior::point<double,2ul>,perior::cubic_periodic_boundary>
                          ((rectangle<perior::point<double,_2UL>_> *)&local_98,b);
        dVar9 = tVar3 - tVar2;
        if (dVar9 < local_c0) {
LAB_0010beab:
          puVar5 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&local_a0);
          local_a8 = *puVar5;
          uVar7 = SUB84(tVar3,0);
          uVar8 = (undefined4)((ulong)tVar3 >> 0x20);
          if (local_b8 <= tVar3) {
            uVar7 = SUB84(local_b8,0);
            uVar8 = (undefined4)((ulong)local_b8 >> 0x20);
          }
          local_b8 = (double)CONCAT44(uVar8,uVar7);
          local_c0 = dVar9;
        }
        else if (((dVar9 == local_c0) && (!NAN(dVar9) && !NAN(local_c0))) && (tVar3 < local_b8))
        goto LAB_0010beab;
        boost::container::vec_iterator<unsigned_long_*,_true>::operator++(&local_a0);
        uVar7 = SUB84(local_c0,0);
        uVar8 = (undefined4)((ulong)local_c0 >> 0x20);
      }
    }
  }
  return local_a8;
}

Assistant:

std::size_t choose_leaf(const indexable_type& entry)
    {
        if(this->root_ == nil)
        {
            node_type n(true, nil);
            n.box = make_aabb(entry);
            this->root_ = this->add_node(n);

            return this->root_;
        }

        // choose a leaf to insert
        // so if root is a leaf, return it
        std::size_t node_idx = this->root_;
        while(!(this->tree_.at(node_idx).is_leaf))
        {
            // find minimum expansion
            scalar_type diff_area_min = std::numeric_limits<scalar_type>::max();
            scalar_type area_min      = std::numeric_limits<scalar_type>::max();

            const node_type& node = this->tree_.at(node_idx);
            for(typename node_type::const_iterator
                    i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
            {
                const scalar_type area_initial
                    = area(this->tree_.at(*i).box, this->boundary_);

                const scalar_type area_expanded
                    = area(expand(this->tree_.at(*i).box, entry, this->boundary_),
                           this->boundary_);

                const scalar_type diff_area = area_expanded - area_initial;
                if((diff_area <  diff_area_min) ||
                   (diff_area == diff_area_min  && area_expanded < area_min))
                {
                    node_idx = *i;
                    diff_area_min = diff_area;
                    area_min      = std::min(area_min, area_expanded);
                }
            }
        }
        return node_idx;
    }